

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::
unordered_flat_set<unsigned_int,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
::unordered_flat_set<unsigned_int_const*>
          (unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *this,uint *first,uint *last,size_type n,hasher *h,key_equal *pred,allocator_type *a)

{
  key_equal *in_RDI;
  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_R9;
  uint *unaff_retaddr;
  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_00000008;
  hasher *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  
  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_flat_set
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI,
             (allocator_type *)0x237949);
  insert<unsigned_int_const*>(in_stack_00000008,unaff_retaddr,(uint *)in_RDI);
  return;
}

Assistant:

unordered_flat_set(Iterator first, Iterator last, size_type n = 0, hasher const& h = hasher(),
                       key_equal const& pred = key_equal(),
                       allocator_type const& a = allocator_type()) :
        unordered_flat_set(n, h, pred, a) {
        this->insert(first, last);
    }